

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::SupportedCombinationTest::iterate(SupportedCombinationTest *this)

{
  bool bVar1;
  FormatDB *this_00;
  reference pIVar2;
  pair<std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>,_bool> pVar3;
  _Self local_158;
  _Self local_150;
  const_iterator stc;
  _Self local_140;
  _Self local_138;
  const_iterator dep;
  _Self local_128;
  _Self local_120;
  const_iterator col;
  bool local_e5;
  undefined1 local_e4 [7];
  bool succ;
  FormatCombination comb;
  Formats stencilFmts;
  undefined1 local_80 [8];
  Formats depthFmts;
  Formats colorFmts;
  ImageFormat none;
  FormatDB *db;
  SupportedCombinationTest *this_local;
  
  this_00 = deqp::gls::fboc::details::Context::getCoreFormats((this->super_TestBase).m_ctx);
  colorFmts._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)deqp::gls::FboUtil::ImageFormat::none();
  deqp::gls::FboUtil::FormatDB::getFormats
            ((Formats *)&depthFmts._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00,
             COLOR_RENDERABLE);
  deqp::gls::FboUtil::FormatDB::getFormats((Formats *)local_80,this_00,DEPTH_RENDERABLE);
  deqp::gls::FboUtil::FormatDB::getFormats((Formats *)&comb.stencilFmt,this_00,STENCIL_RENDERABLE);
  local_e5 = false;
  std::
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::insert((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
            *)&depthFmts._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (value_type *)&colorFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
  ::insert((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
            *)local_80,(value_type *)&colorFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pVar3 = std::
          set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
          ::insert((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                    *)&comb.stencilFmt,
                   (value_type *)&colorFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  col._M_node = (_Base_ptr)pVar3.first._M_node;
  local_120._M_node =
       (_Base_ptr)
       std::
       set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
       ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                *)&depthFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    local_128._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                *)&depthFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::operator!=(&local_120,&local_128);
    if (!bVar1) {
      if (local_e5 == false) {
        deqp::gls::fboc::details::TestBase::fail
                  (&this->super_TestBase,"No supported format combination found");
      }
      else {
        deqp::gls::fboc::details::TestBase::pass(&this->super_TestBase);
      }
      std::
      set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~set((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
              *)&comb.stencilFmt);
      std::
      set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~set((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
              *)local_80);
      std::
      set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
      ::~set((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
              *)&depthFmts._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return STOP;
    }
    pIVar2 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_120);
    unique0x00012000 = *pIVar2;
    pIVar2 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_120);
    dep._M_node = *(_Base_ptr *)pIVar2;
    local_e4._0_4_ = formatKind(this,(ImageFormat)dep._M_node);
    local_138._M_node =
         (_Base_ptr)
         std::
         set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
         ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)local_80);
    while( true ) {
      local_140._M_node =
           (_Base_ptr)
           std::
           set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
           ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                  *)local_80);
      bVar1 = std::operator!=(&local_138,&local_140);
      if (!bVar1) break;
      pIVar2 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_138);
      comb._8_8_ = *pIVar2;
      pIVar2 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*(&local_138);
      stc._M_node = *(_Base_ptr *)pIVar2;
      comb.colorFmt.format = formatKind(this,(ImageFormat)stc._M_node);
      local_150._M_node =
           (_Base_ptr)
           std::
           set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
           ::begin((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                    *)&comb.stencilFmt);
      while( true ) {
        local_158._M_node =
             (_Base_ptr)
             std::
             set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
             ::end((set<deqp::gls::FboUtil::ImageFormat,_std::less<deqp::gls::FboUtil::ImageFormat>,_std::allocator<deqp::gls::FboUtil::ImageFormat>_>
                    *)&comb.stencilFmt);
        bVar1 = std::operator!=(&local_150,&local_158);
        if (!bVar1) break;
        pIVar2 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*
                           (&local_150);
        comb._20_8_ = *pIVar2;
        pIVar2 = std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator*
                           (&local_150);
        comb.depthFmt.format = formatKind(this,*pIVar2);
        local_e5 = tryCombination(this,(FormatCombination *)local_e4);
        if (local_e5) break;
        std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator++(&local_150,0);
      }
      std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator++(&local_138,0);
    }
    std::_Rb_tree_const_iterator<deqp::gls::FboUtil::ImageFormat>::operator++(&local_120,0);
  } while( true );
}

Assistant:

IterateResult SupportedCombinationTest::iterate (void)
{
	const FormatDB& db		= m_ctx.getCoreFormats();
	const ImageFormat none	= ImageFormat::none();
	Formats colorFmts		= db.getFormats(COLOR_RENDERABLE);
	Formats depthFmts		= db.getFormats(DEPTH_RENDERABLE);
	Formats stencilFmts		= db.getFormats(STENCIL_RENDERABLE);
	FormatCombination comb;
	bool succ = false;

	colorFmts.insert(none);
	depthFmts.insert(none);
	stencilFmts.insert(none);

	for (Formats::const_iterator col = colorFmts.begin(); col != colorFmts.end(); col++)
	{
		comb.colorFmt = *col;
		comb.colorKind = formatKind(*col);
		for (Formats::const_iterator dep = depthFmts.begin(); dep != depthFmts.end(); dep++)
		{
			comb.depthFmt = *dep;
			comb.depthKind = formatKind(*dep);
			for (Formats::const_iterator stc = stencilFmts.begin();
				 stc != stencilFmts.end(); stc++)
			{
				comb.stencilFmt = *stc;
				comb.stencilKind = formatKind(*stc);
				succ = tryCombination(comb);
				if (succ)
					break;
			}
		}
	}

	if (succ)
		pass();
	else
		fail("No supported format combination found");

	return STOP;
}